

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

object * gcialloc(int sz)

{
  int sz_00;
  object *local_20;
  object *result;
  int trueSize;
  int sz_local;
  
  sz_00 = (sz + 7) / 8;
  memoryPointer = (object *)((long)&memoryPointer->header + (long)((sz_00 + 2) * -8));
  if ((long)memoryPointer < (long)memoryBase) {
    local_20 = gcollect(sz_00);
  }
  else {
    memoryPointer->header = (ulong)(uint)(sz_00 << 2);
    local_20 = memoryPointer;
  }
  local_20->header = (ulong)(uint)(sz << 2);
  local_20->header = local_20->header | 2;
  return local_20;
}

Assistant:

struct object *gcialloc(int sz)
{
    int trueSize;
    struct object *result;

    trueSize = TO_WORDS(sz);
    result = gcalloc(trueSize);
    SET_SIZE(result, sz);
    SET_BINOBJ(result);
    return result;
}